

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int choose_size_bytes(uint32_t size,int spare_msbs)

{
  int iVar1;
  uint uVar2;
  
  if ((int)size < 0 && 0 < spare_msbs) {
    iVar1 = -1;
  }
  else {
    uVar2 = size << ((byte)spare_msbs & 0x1f);
    if (uVar2 < 0x1000000) {
      if (uVar2 < 0x10000) {
        return 2 - (uint)(uVar2 < 0x100);
      }
      iVar1 = 3;
    }
    else {
      iVar1 = 4;
    }
  }
  return iVar1;
}

Assistant:

static int choose_size_bytes(uint32_t size, int spare_msbs) {
  // Choose the number of bytes required to represent size, without
  // using the 'spare_msbs' number of most significant bits.

  // Make sure we will fit in 4 bytes to start with..
  if (spare_msbs > 0 && size >> (32 - spare_msbs) != 0) return -1;

  // Normalise to 32 bits
  size <<= spare_msbs;

  if (size >> 24 != 0)
    return 4;
  else if (size >> 16 != 0)
    return 3;
  else if (size >> 8 != 0)
    return 2;
  else
    return 1;
}